

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O0

BOOL all_chests_accessible(void)

{
  dungeon_map *map;
  size_t height;
  size_t width;
  size_t y;
  size_t x;
  size_t i;
  
  x = 0;
  do {
    if (indexes[x] == NO_MAP) {
      return TRUE;
    }
    for (y = 0; y < maps[x].width; y = y + 1) {
      for (width = 0; width < maps[x].width; width = width + 1) {
        if (maps[x].tiles[y][width] == '\x04') {
          return FALSE;
        }
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

static BOOL all_chests_accessible()
{
    size_t i, x, y, width, height;
    dungeon_map *map;

    for (i=0; indexes[i]; i++) {
        map = &maps[i];
        for (x=0; x < map->width; x++) {
            for (y=0; y < map->width; y++) {
                if (map->tiles[x][y] == DUNGEON_TILE_CHEST)
                    return FALSE;
            }
        }
    }
    return TRUE;
}